

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O2

int si9ma::DP::find_way_recursive(int *arr,int length,int start,int aim,int step)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = 0;
  do {
    uVar1 = 0;
    if (arr == (int *)0x0) {
      iVar3 = 0;
      uVar2 = uVar1;
LAB_0010c376:
      return iVar3 + uVar2;
    }
    iVar5 = -step;
    do {
      iVar4 = start;
      iVar5 = iVar5 + 1;
      uVar2 = 0;
      if ((((iVar4 < 0) || (length <= aim)) || (uVar2 = uVar1, aim < 0)) || (length <= iVar4))
      goto LAB_0010c376;
      if (iVar5 == 1) {
        uVar2 = (uint)(iVar4 == aim);
        goto LAB_0010c376;
      }
      start = 1;
    } while ((iVar4 == 0) || (start = length + -2, length + -1 == iVar4));
    step = -iVar5;
    iVar5 = find_way_recursive(arr,length,iVar4 + 1,aim,step);
    start = iVar4 + -1;
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

int DP::find_way_recursive(const int *arr, int length,int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        if(step == 0)
            return start == aim;

        if(start == 0)
            return find_way_recursive(arr,length,1,aim,step - 1);

        if(start == length - 1)
            return find_way_recursive(arr,length,length - 2,aim,step - 1);

        return find_way_recursive(arr,length,start + 1,aim,step - 1)
               + find_way_recursive(arr,length,start - 1,aim,step - 1);
    }